

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strequal.c
# Opt level: O1

int curl_strnequal(char *first,char *second,size_t max)

{
  char cVar1;
  uint uVar2;
  __int32_t **pp_Var3;
  char cVar4;
  char *pcVar5;
  
  cVar4 = *first;
  if (cVar4 != '\0') {
    pcVar5 = first + 1;
    do {
      cVar1 = *second;
      if (((long)cVar1 == 0) || (max == 0)) break;
      pp_Var3 = __ctype_toupper_loc();
      if ((*pp_Var3)[cVar4] != (*pp_Var3)[cVar1]) {
        max = 1;
        break;
      }
      max = max - 1;
      second = second + 1;
      cVar4 = *pcVar5;
      pcVar5 = pcVar5 + 1;
    } while (cVar4 != '\0');
  }
  if (max == 0) {
    uVar2 = 1;
  }
  else {
    pp_Var3 = __ctype_toupper_loc();
    uVar2 = (uint)((*pp_Var3)[cVar4] == (*pp_Var3)[*second]);
  }
  return uVar2;
}

Assistant:

int curl_strnequal(const char *first, const char *second, size_t max)
{
#if defined(HAVE_STRNCASECMP)
  return !strncasecmp(first, second, max);
#elif defined(HAVE_STRNCMPI)
  return !strncmpi(first, second, max);
#elif defined(HAVE_STRNICMP)
  return !strnicmp(first, second, max);
#else
  while(*first && *second && max) {
    if(toupper(*first) != toupper(*second)) {
      break;
    }
    max--;
    first++;
    second++;
  }
  if(0 == max)
    return 1; /* they are equal this far */

  return toupper(*first) == toupper(*second);
#endif
}